

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxthread.c
# Opt level: O2

void * thread_proc_trampoline(void *data)

{
  (**(code **)((long)data + 0x38))(data,*(undefined8 *)((long)data + 0x40));
  return (void *)0x0;
}

Assistant:

static void *thread_proc_trampoline(void *data)
{
   _AL_THREAD *thread = data;
   /* Android is special and needs to attach/detach threads with Java */
#ifdef ALLEGRO_ANDROID
   _al_android_thread_created();
#endif
   (*thread->proc)(thread, thread->arg);
#ifdef ALLEGRO_ANDROID
   _al_android_thread_ended();
#endif
   return NULL;
}